

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_12::NameApplier::VisitElemSegment
          (NameApplier *this,Index elem_segment_index,ElemSegment *segment)

{
  bool bVar1;
  Result RVar2;
  ExprType EVar3;
  reference this_00;
  reference this_01;
  VarExpr<(wabt::ExprType)36> *pVVar4;
  Expr *expr;
  ExprList *elem_expr;
  iterator __end2;
  iterator __begin2;
  ExprListVector *__range2;
  ElemSegment *segment_local;
  Index elem_segment_index_local;
  NameApplier *this_local;
  
  RVar2 = UseNameForTableVar(this,&segment->table_var);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ExprVisitor::VisitExprList(&this->visitor_,&segment->offset);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      __end2 = std::
               vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ::begin(&segment->elem_exprs);
      elem_expr = (ExprList *)
                  std::
                  vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                  ::end(&segment->elem_exprs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                         *)&elem_expr), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                  ::operator*(&__end2);
        this_01 = intrusive_list<wabt::Expr>::front(this_00);
        EVar3 = Expr::type(this_01);
        if (EVar3 == RefFunc) {
          pVVar4 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(this_01);
          RVar2 = UseNameForFuncVar(this,&pVVar4->var);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        __gnu_cxx::
        __normal_iterator<wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
        ::operator++(&__end2);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::VisitElemSegment(Index elem_segment_index,
                                     ElemSegment* segment) {
  CHECK_RESULT(UseNameForTableVar(&segment->table_var));
  CHECK_RESULT(visitor_.VisitExprList(segment->offset));
  for (ExprList& elem_expr : segment->elem_exprs) {
    Expr* expr = &elem_expr.front();
    if (expr->type() == ExprType::RefFunc) {
      CHECK_RESULT(UseNameForFuncVar(&cast<RefFuncExpr>(expr)->var));
    }
  }
  return Result::Ok;
}